

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UVector * __thiscall
icu_63::ICUService::getVisibleIDs
          (ICUService *this,UVector *result,UnicodeString *matchID,UErrorCode *status)

{
  UnicodeString *that;
  UBool UVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  UHashElement *pUVar4;
  UnicodeString *pUVar5;
  UnicodeString *local_b8;
  UnicodeString *idClone;
  UnicodeString *id;
  UHashElement *e;
  long *plStack_58;
  int32_t pos;
  ICUServiceKey *fallbackKey;
  Hashtable *local_40;
  Hashtable *map;
  Mutex mutex;
  UErrorCode *status_local;
  UnicodeString *matchID_local;
  UVector *result_local;
  ICUService *this_local;
  
  mutex.fMutex = (UMutex *)status;
  UVector::removeAllElements(result);
  UVar1 = ::U_FAILURE(((mutex.fMutex)->fMutex).__data.__lock);
  if (UVar1 == '\0') {
    Mutex::Mutex((Mutex *)&map,(UMutex *)icu_63::lock);
    local_40 = getVisibleIDMap(this,(UErrorCode *)mutex.fMutex);
    if (local_40 != (Hashtable *)0x0) {
      iVar3 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,mutex.fMutex);
      plStack_58 = (long *)CONCAT44(extraout_var,iVar3);
      e._4_4_ = 0xffffffff;
      do {
        do {
          pUVar5 = (UnicodeString *)((long)&e + 4);
          pUVar4 = Hashtable::nextElement(local_40,(int32_t *)pUVar5);
          if (pUVar4 == (UHashElement *)0x0) goto LAB_0036af54;
          that = (UnicodeString *)(pUVar4->key).pointer;
        } while ((plStack_58 != (long *)0x0) &&
                (pUVar5 = that, cVar2 = (**(code **)(*plStack_58 + 0x40))(), cVar2 == '\0'));
        pUVar5 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar5);
        local_b8 = (UnicodeString *)0x0;
        if (pUVar5 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(pUVar5,that);
          local_b8 = pUVar5;
        }
        if ((local_b8 == (UnicodeString *)0x0) ||
           (UVar1 = UnicodeString::isBogus(local_b8), UVar1 != '\0')) {
          if (local_b8 != (UnicodeString *)0x0) {
            (*(local_b8->super_Replaceable).super_UObject._vptr_UObject[1])();
          }
          ((mutex.fMutex)->fMutex).__data.__lock = 7;
          goto LAB_0036af54;
        }
        UVector::addElement(result,local_b8,(UErrorCode *)mutex.fMutex);
        UVar1 = ::U_FAILURE(((mutex.fMutex)->fMutex).__data.__lock);
      } while (UVar1 == '\0');
      if (local_b8 != (UnicodeString *)0x0) {
        (*(local_b8->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
LAB_0036af54:
      if (plStack_58 != (long *)0x0) {
        (**(code **)(*plStack_58 + 8))();
      }
    }
    Mutex::~Mutex((Mutex *)&map);
    UVar1 = ::U_FAILURE(((mutex.fMutex)->fMutex).__data.__lock);
    if (UVar1 != '\0') {
      UVector::removeAllElements(result);
    }
  }
  return result;
}

Assistant:

UVector& 
ICUService::getVisibleIDs(UVector& result, const UnicodeString* matchID, UErrorCode& status) const 
{
    result.removeAllElements();

    if (U_FAILURE(status)) {
        return result;
    }

    {
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceKey* fallbackKey = createKey(matchID, status);

            for (int32_t pos = UHASH_FIRST;;) {
                const UHashElement* e = map->nextElement(pos);
                if (e == NULL) {
                    break;
                }

                const UnicodeString* id = (const UnicodeString*)e->key.pointer;
                if (fallbackKey != NULL) {
                    if (!fallbackKey->isFallbackOf(*id)) {
                        continue;
                    }
                }

                UnicodeString* idClone = new UnicodeString(*id);
                if (idClone == NULL || idClone->isBogus()) {
                    delete idClone;
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                result.addElement(idClone, status);
                if (U_FAILURE(status)) {
                    delete idClone;
                    break;
                }
            }
            delete fallbackKey;
        }
    }
    if (U_FAILURE(status)) {
        result.removeAllElements();
    }
    return result;
}